

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O3

int linenoise::unicodeReadUTF8Char(int fd,char *buf,int *cp)

{
  byte bVar1;
  int iVar2;
  ssize_t sVar3;
  uint uVar4;
  size_t __nbytes;
  long lVar5;
  
  sVar3 = read(fd,buf,1);
  iVar2 = (int)sVar3;
  if (0 < iVar2) {
    bVar1 = *buf;
    uVar4 = (uint)bVar1;
    iVar2 = 1;
    if ((char)bVar1 < '\0') {
      if ((uVar4 & 0xffffffe0) == 0xc0) {
        __nbytes = 1;
      }
      else if ((bVar1 & 0xf0) == 0xe0) {
        __nbytes = 2;
      }
      else {
        if ((bVar1 & 0xf8) != 0xf0) {
          return -1;
        }
        __nbytes = 3;
      }
      sVar3 = read(fd,buf + 1,__nbytes);
      if ((int)sVar3 < 1) {
        return (int)sVar3;
      }
      bVar1 = *buf;
      uVar4 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar4 = (uint)bVar1;
        if ((bVar1 & 0xe0) == 0xc0) {
          uVar4 = (uVar4 & 0x1f) << 6;
          iVar2 = 2;
          lVar5 = 1;
        }
        else if ((uVar4 & 0xfffffff0) == 0xe0) {
          uVar4 = ((byte)buf[1] & 0x3f) << 6 | (uVar4 & 0xf) << 0xc;
          iVar2 = 3;
          lVar5 = 2;
        }
        else {
          if ((uVar4 & 0xfffffff8) != 0xf0) {
            return 0;
          }
          uVar4 = ((byte)buf[2] & 0x3f) << 6 | ((byte)buf[1] & 0x3f) << 0xc | (uVar4 & 7) << 0x12;
          iVar2 = 4;
          lVar5 = 3;
        }
        uVar4 = (byte)buf[lVar5] & 0x3f | uVar4;
      }
    }
    *cp = uVar4;
  }
  return iVar2;
}

Assistant:

inline int unicodeReadUTF8Char(int fd, char* buf, int* cp)
{
    int nread = read(fd,&buf[0],1);

    if (nread <= 0) { return nread; }

    unsigned char byte = buf[0];

    if ((byte & 0x80) == 0) {
        ;
    } else if ((byte & 0xE0) == 0xC0) {
        nread = read(fd,&buf[1],1);
        if (nread <= 0) { return nread; }
    } else if ((byte & 0xF0) == 0xE0) {
        nread = read(fd,&buf[1],2);
        if (nread <= 0) { return nread; }
    } else if ((byte & 0xF8) == 0xF0) {
        nread = read(fd,&buf[1],3);
        if (nread <= 0) { return nread; }
    } else {
        return -1;
    }

    return unicodeUTF8CharToCodePoint(buf, 4, cp);
}